

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O1

mpt_named_traits * mpt_named_traits(char *name,int len)

{
  byte bVar1;
  bool bVar2;
  mpt_named_traits **ppmVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  mpt_named_traits *__n;
  mpt_named_traits *pmVar8;
  long lVar9;
  named_traits_chunk *pnVar10;
  ulong uVar11;
  char *pcVar12;
  mpt_named_traits *local_48;
  
  if ((len != 0 && name != (char *)0x0) && (*name != '\0')) {
    __n = (mpt_named_traits *)(ulong)(uint)len;
    if (len < 0) {
      sVar5 = strlen(name);
      if ((int)sVar5 != 0) {
        iVar4 = strcmp(name,"log");
        if (iVar4 == 0) {
          pcVar12 = "logger";
        }
        else {
          iVar4 = strcmp(name,"iter");
          if (iVar4 == 0) {
            pcVar12 = "iterator";
          }
          else {
            iVar4 = strcmp(name,"out");
            if (iVar4 == 0) {
              pcVar12 = "output";
            }
            else {
              iVar4 = strcmp(name,"meta");
              pcVar12 = "metatype";
              if (iVar4 != 0) {
                pcVar12 = name;
              }
            }
          }
        }
        pnVar10 = meta_types;
        if (meta_types == (named_traits_chunk *)0x0) {
          _meta_init();
          pnVar10 = meta_types;
        }
        for (; pnVar10 != (named_traits_chunk *)0x0; pnVar10 = pnVar10->next) {
          bVar1 = pnVar10->used;
          if ((ulong)bVar1 != 0) {
            uVar11 = 0;
            pmVar8 = __n;
            do {
              __n = pnVar10->traits[uVar11];
              if ((__n->name == (char *)0x0) || (iVar4 = strcmp(pcVar12,__n->name), iVar4 != 0)) {
                bVar2 = true;
                __n = pmVar8;
              }
              else {
                bVar2 = false;
              }
              if (!bVar2) {
                return __n;
              }
              uVar11 = uVar11 + 1;
              pmVar8 = __n;
            } while (bVar1 != uVar11);
          }
        }
        if (interface_types == (mpt_named_traits **)0x0) {
          _interfaces_init();
        }
        ppmVar3 = interface_types;
        lVar9 = (long)interface_pos;
        if (0 < lVar9) {
          lVar7 = 0;
          do {
            pmVar8 = ppmVar3[lVar7];
            if (((pmVar8 == (mpt_named_traits *)0x0) || (pmVar8->name == (char *)0x0)) ||
               (iVar4 = strcmp(pcVar12,pmVar8->name), iVar4 != 0)) {
              bVar2 = true;
              pmVar8 = __n;
            }
            else {
              bVar2 = false;
            }
            if (!bVar2) {
              return pmVar8;
            }
            lVar7 = lVar7 + 1;
            __n = pmVar8;
          } while (lVar9 != lVar7);
        }
      }
    }
    else {
      pnVar10 = meta_types;
      if (meta_types == (named_traits_chunk *)0x0) {
        _meta_init();
        pnVar10 = meta_types;
      }
      for (; pnVar10 != (named_traits_chunk *)0x0; pnVar10 = pnVar10->next) {
        bVar1 = pnVar10->used;
        if ((ulong)bVar1 != 0) {
          uVar11 = 0;
          do {
            pmVar8 = pnVar10->traits[uVar11];
            pcVar12 = pmVar8->name;
            if (((pcVar12 == (char *)0x0) || (sVar5 = strlen(pcVar12), (int)sVar5 != len)) ||
               (iVar4 = strncmp(name,pcVar12,(size_t)__n), iVar4 != 0)) {
              bVar2 = true;
            }
            else {
              bVar2 = false;
              local_48 = pmVar8;
            }
            if (!bVar2) {
              return local_48;
            }
            uVar11 = uVar11 + 1;
          } while (bVar1 != uVar11);
        }
      }
      if (interface_types == (mpt_named_traits **)0x0) {
        _interfaces_init();
      }
      ppmVar3 = interface_types;
      lVar9 = (long)interface_pos;
      if (0 < lVar9) {
        lVar7 = 0;
        do {
          pmVar8 = ppmVar3[lVar7];
          if (((pmVar8 == (mpt_named_traits *)0x0) ||
              (pcVar12 = pmVar8->name, pcVar12 == (char *)0x0)) ||
             ((sVar5 = strlen(pcVar12), (int)sVar5 != len ||
              (iVar4 = strncmp(name,pcVar12,(size_t)__n), iVar4 != 0)))) {
            bVar2 = true;
          }
          else {
            bVar2 = false;
            local_48 = pmVar8;
          }
          if (!bVar2) {
            return local_48;
          }
          lVar7 = lVar7 + 1;
        } while (lVar9 != lVar7);
      }
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 0x16;
  return (mpt_named_traits *)0x0;
}

Assistant:

extern const MPT_STRUCT(named_traits) *mpt_named_traits(const char *name, int len)
{
	const struct named_traits_chunk *ext;
	
	int i;
	
	if (!name || !len || !*name) {
		errno = EINVAL;
		return 0;
	}
	/* exact length match for names */
	if (len >= 0) {
		if (!(ext = meta_types)) {
			_meta_init();
			ext = meta_types;
		}
		while (ext) {
			for (i = 0; i < ext->used; i++) {
				const MPT_STRUCT(named_traits) *elem = ext->traits[i];
				if (elem->name
				 && (len == (int) strlen(elem->name))
				 && !strncmp(name, elem->name, len)) {
					return elem;
				}
			}
			ext = ext->next;
		}
		if (!interface_types) {
			_interfaces_init();
		}
		for (i = 0; i < interface_pos; i++) {
			const MPT_STRUCT(named_traits) *elem;
			if ((elem = interface_types[i])
			 && elem->name
			 && (len == (int) strlen(elem->name))
			 && !strncmp(name, elem->name, len)) {
				return elem;
			}
		}
		errno = EINVAL;
		return 0;
	}
	/* full names without length limit */
	if (!(len = strlen(name))) {
		errno = EINVAL;
		return 0;
	}
	/* resolve shortnames */
	if (!strcmp(name, "log")) {
		name = "logger";
	}
	else if (!strcmp(name, "iter")) {
		name = "iterator";
	}
	else if (!strcmp(name, "out")) {
		name = "output";
	}
	else if (!strcmp(name, "meta")) {
		name = "metatype";
	}
	if (!(ext = meta_types)) {
		_meta_init();
		ext = meta_types;
	}
	while (ext) {
		for (i = 0; i < ext->used; i++) {
			const MPT_STRUCT(named_traits) *elem = ext->traits[i];
			if (elem->name && !strcmp(name, elem->name)) {
				return elem;
			}
		}
		ext = ext->next;
	}
	if (!interface_types) {
		_interfaces_init();
	}
	for (i = 0; i < interface_pos; i++) {
		const MPT_STRUCT(named_traits) *elem = interface_types[i];
		if (elem && elem->name && !strcmp(name, elem->name)) {
			return elem;
		}
	}
	errno = EINVAL;
	return 0;
}